

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O2

int __thiscall
ncnn::MatMul::forward
          (MatMul *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  int iVar1;
  Mat *this_01;
  Mat *this_02;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  int *piVar22;
  Option *pOVar23;
  ulong uVar24;
  Option *opt_00;
  Option *opt_01;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  float fVar33;
  Mat m_2;
  Mat local_220;
  Mat local_1d8;
  Mat local_188;
  Option *local_140;
  undefined8 local_138;
  Option *local_130;
  Mat m;
  Mat m_7;
  Mat local_78;
  
  uVar20 = local_1d8.elemsize._4_4_;
  uVar19 = (undefined4)local_1d8.elemsize;
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar32 = this_01->dims;
  uVar30 = this_01[1].dims;
  uVar2 = uVar30;
  if ((int)uVar30 < (int)uVar32) {
    uVar2 = uVar32;
  }
  pOVar23 = (Option *)this_01->elemsize;
  local_138 = this;
  if ((uVar32 ^ 1) == 0 && (uVar30 ^ 1) == 0) {
    Mat::create(this_02,1,(size_t)pOVar23,opt->blob_allocator);
    if ((float *)this_02->data == (float *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep != 0) {
      uVar27 = 0;
      uVar29 = (ulong)(uint)this_01->w;
      if (this_01->w < 1) {
        uVar29 = uVar27;
      }
      fVar33 = 0.0;
      for (; uVar29 != uVar27; uVar27 = uVar27 + 1) {
        fVar33 = fVar33 + *(float *)((long)this_01[1].data + uVar27 * 4) *
                          *(float *)((long)this_01->data + uVar27 * 4);
      }
      *(float *)this_02->data = fVar33;
      return 0;
    }
    return -100;
  }
  this_00 = this_01 + 1;
  local_140 = pOVar23;
  local_130 = opt;
  if ((uVar32 ^ 2) == 0 && (uVar30 ^ 2) == 0) {
    Mat::create(this_02,(&this_01[1].w)[this->transB != 0],this_01->h,(size_t)pOVar23,
                opt->blob_allocator);
    if (this_02->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    local_1d8.cstep = 0;
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    if (local_138->transB == 0) {
      pOVar23 = local_140;
      Mat::create(&local_1d8,this_01[1].h,this_01[1].w,(size_t)local_140,
                  local_130->workspace_allocator);
      if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
        piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar22 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 != 0) {
          return -100;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_004b5bf5;
      }
      transpose(this_00,&local_1d8,opt_00);
    }
    else if (&local_1d8 != this_00) {
      piVar22 = this_01[1].refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      local_1d8.data = this_01[1].data;
      local_1d8.refcount._0_4_ = SUB84(this_01[1].refcount,0);
      local_1d8.refcount._4_4_ = (undefined4)((ulong)this_01[1].refcount >> 0x20);
      local_1d8.elemsize._0_4_ = (undefined4)this_01[1].elemsize;
      local_1d8.elemsize._4_4_ = (undefined4)(this_01[1].elemsize >> 0x20);
      local_1d8.elempack = this_01[1].elempack;
      local_1d8.allocator = this_01[1].allocator;
      uVar11 = this_01[1].dims;
      uVar12 = this_01[1].w;
      uVar13 = this_01[1].h;
      uVar14 = this_01[1].d;
      local_1d8.c = this_01[1].c;
      local_1d8.cstep = this_01[1].cstep;
      local_1d8.dims = uVar11;
      local_1d8.w = uVar12;
      local_1d8.h = uVar13;
      local_1d8.d = uVar14;
    }
    matmul_transb(this_01,&local_1d8,this_02,pOVar23);
    piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar22 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 != 0) {
      return 0;
    }
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      return 0;
    }
    goto LAB_004b5a55;
  }
  if ((uVar32 ^ 1) == 0 && (uVar30 ^ 2) == 0) {
    iVar1 = (&this_01[1].w)[this->transB != 0];
    local_1d8.cstep = 0;
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    Mat::create(&local_1d8,iVar1,1,(size_t)pOVar23,opt->blob_allocator);
    if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
      piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar22 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 != 0) {
        return -100;
      }
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_004b5bf5;
    }
    pOVar23 = (Option *)0x1;
    Mat::reshape(&local_220,this_01,this_01->w,1,(Allocator *)0x0);
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    if (local_138->transB == 0) {
      pOVar23 = local_140;
      Mat::create(&local_188,this_01[1].h,this_01[1].w,(size_t)local_140,
                  local_130->workspace_allocator);
      if ((local_188.data == (void *)0x0) || ((long)local_188.c * local_188.cstep == 0)) {
        piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              free(local_188.data);
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_220.refcount != (int *)0x0) {
          LOCK();
          *local_220.refcount = *local_220.refcount + -1;
          UNLOCK();
          if (*local_220.refcount == 0) {
            if (local_220.allocator == (Allocator *)0x0) {
              free(local_220.data);
            }
            else {
              (*(local_220.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar22 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 != 0) {
          return -100;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_004b5bf5;
      }
      transpose(this_00,&local_188,opt_01);
    }
    else if (&local_188 != this_00) {
      piVar22 = this_01[1].refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      local_188.data = this_01[1].data;
      local_188.refcount._0_4_ = SUB84(this_01[1].refcount,0);
      local_188.refcount._4_4_ = (undefined4)((ulong)this_01[1].refcount >> 0x20);
      local_188.elemsize._0_4_ = (undefined4)this_01[1].elemsize;
      local_188.elemsize._4_4_ = (undefined4)(this_01[1].elemsize >> 0x20);
      local_188.elempack = this_01[1].elempack;
      local_188.allocator = this_01[1].allocator;
      uVar15 = this_01[1].dims;
      uVar16 = this_01[1].w;
      uVar17 = this_01[1].h;
      uVar18 = this_01[1].d;
      local_188.c = this_01[1].c;
      local_188.cstep = this_01[1].cstep;
      local_188.dims = uVar15;
      local_188.w = uVar16;
      local_188.h = uVar17;
      local_188.d = uVar18;
    }
    matmul_transb(&local_220,&local_188,&local_1d8,pOVar23);
    Mat::reshape(&m_2,&local_1d8,iVar1,(Allocator *)0x0);
    piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
    if (this_02 != &m_2) {
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      piVar22 = this_02->refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (this_02->allocator == (Allocator *)0x0) {
            free(this_02->data);
          }
          else {
            (*this_02->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_02->data = m_2.data;
      piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      this_02->refcount = piVar22;
      this_02->elemsize = CONCAT44(m_2.elemsize._4_4_,(undefined4)m_2.elemsize);
      this_02->elempack = m_2.elempack;
      this_02->allocator = m_2.allocator;
      this_02->dims = m_2.dims;
      this_02->w = m_2.w;
      this_02->h = m_2.h;
      this_02->d = m_2.d;
      this_02->c = m_2.c;
      this_02->cstep = m_2.cstep;
    }
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (m_2.allocator == (Allocator *)0x0) {
          free(m_2.data);
        }
        else {
          (*(m_2.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          free(local_188.data);
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_220.refcount != (int *)0x0) {
      LOCK();
      *local_220.refcount = *local_220.refcount + -1;
      UNLOCK();
      if (*local_220.refcount == 0) {
        if (local_220.allocator == (Allocator *)0x0) {
          free(local_220.data);
        }
        else {
          (*(local_220.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar22 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 != 0) {
      return 0;
    }
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      return 0;
    }
    goto LAB_004b5a55;
  }
  if ((uVar32 ^ 2) == 0 && (uVar30 ^ 1) == 0) {
    iVar1 = this_01->h;
    local_1d8.cstep = 0;
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    Mat::create(&local_1d8,1,iVar1,(size_t)pOVar23,opt->blob_allocator);
    if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
      piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar22 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 != 0) {
        return -100;
      }
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_004b5bf5;
    }
    pOVar23 = (Option *)0x1;
    Mat::reshape(&local_220,this_00,this_01[1].w,1,(Allocator *)0x0);
    matmul_transb(this_01,&local_220,&local_1d8,pOVar23);
    Mat::reshape(&local_188,&local_1d8,iVar1,(Allocator *)0x0);
    piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (this_02 != &local_188) {
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      piVar22 = this_02->refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (this_02->allocator == (Allocator *)0x0) {
            free(this_02->data);
          }
          else {
            (*this_02->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_02->data = local_188.data;
      piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      this_02->refcount = piVar22;
      this_02->elemsize = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      this_02->elempack = local_188.elempack;
      this_02->allocator = local_188.allocator;
      this_02->dims = local_188.dims;
      this_02->w = local_188.w;
      this_02->h = local_188.h;
      this_02->d = local_188.d;
      this_02->c = local_188.c;
      this_02->cstep = local_188.cstep;
    }
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          free(local_188.data);
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_220.refcount != (int *)0x0) {
      LOCK();
      *local_220.refcount = *local_220.refcount + -1;
      UNLOCK();
      if (*local_220.refcount == 0) {
        if (local_220.allocator == (Allocator *)0x0) {
          free(local_220.data);
        }
        else {
          (*(local_220.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar22 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 != 0) {
      return 0;
    }
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      return 0;
    }
    goto LAB_004b5a55;
  }
  if ((int)uVar30 < 3 || uVar32 != 1) {
    if ((int)uVar32 < 3 || uVar30 != 1) {
      local_1d8.elemsize._0_4_ = SUB84(pOVar23,0);
      local_1d8.elemsize._4_4_ = (undefined4)((ulong)pOVar23 >> 0x20);
      if (uVar2 == 4) {
        if (uVar32 == 3) {
          local_1d8.elemsize._0_4_ = uVar19;
          local_1d8.elemsize._4_4_ = uVar20;
          Mat::reshape(&local_1d8,this_01,this_01->w,this_01->h,this_01->c,1,(Allocator *)0x0);
        }
        else {
          local_1d8.data = this_01->data;
          piVar22 = this_01->refcount;
          local_1d8.refcount._0_4_ = SUB84(piVar22,0);
          local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar22 >> 0x20);
          local_1d8.elempack = this_01->elempack;
          local_1d8.allocator = this_01->allocator;
          uVar7 = this_01->w;
          uVar8 = this_01->h;
          uVar9 = this_01->d;
          uVar10 = this_01->c;
          local_1d8.cstep = this_01->cstep;
          local_1d8.dims = uVar32;
          local_1d8.w = uVar7;
          local_1d8.h = uVar8;
          local_1d8.d = uVar9;
          local_1d8.c = uVar10;
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
        }
        if (uVar30 == 3) {
          Mat::reshape(&local_220,this_00,this_01[1].w,this_01[1].h,this_01[1].c,1,(Allocator *)0x0)
          ;
        }
        else {
          local_220.data = this_01[1].data;
          local_220.refcount = this_01[1].refcount;
          local_220.elemsize = this_01[1].elemsize;
          local_220.elempack = this_01[1].elempack;
          local_220.allocator = this_01[1].allocator;
          local_220.dims = this_01[1].dims;
          local_220.w = this_01[1].w;
          local_220.h = this_01[1].h;
          local_220.d = this_01[1].d;
          local_220.c = this_01[1].c;
          local_220.cstep = this_01[1].cstep;
          if (local_220.refcount != (int *)0x0) {
            LOCK();
            *local_220.refcount = *local_220.refcount + 1;
            UNLOCK();
          }
        }
        pOVar23 = local_130;
        uVar32 = local_220.d;
        if (local_220.d < local_1d8.d) {
          uVar32 = local_1d8.d;
        }
        uVar29 = (ulong)uVar32;
        uVar30 = local_220.c;
        if (local_220.c < local_1d8.c) {
          uVar30 = local_1d8.c;
        }
        Mat::create(this_02,(&local_220.w)[local_138->transB != 0],local_1d8.h,uVar32,uVar30,
                    (size_t)local_140,local_130->blob_allocator);
        if ((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
          local_188.cstep = 0;
          local_188.data = (void *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.elemsize._0_4_ = 0;
          local_188.elemsize._4_4_ = 0;
          local_188.elempack = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          local_188.h = 0;
          local_188.d = 0;
          local_188.c = 0;
          if ((local_220.d == 1) && (local_220.c == 1)) {
            if (local_138->transB == 0) {
              Mat::create(&local_188,local_220.h,local_220.w,(size_t)local_140,
                          pOVar23->workspace_allocator);
              if ((local_188.data == (void *)0x0) || ((long)local_188.c * local_188.cstep == 0)) {
                piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                if (piVar22 != (int *)0x0) {
                  LOCK();
                  *piVar22 = *piVar22 + -1;
                  UNLOCK();
                  if (*piVar22 == 0) {
                    if (local_188.allocator == (Allocator *)0x0) {
                      free(local_188.data);
                    }
                    else {
                      (*(local_188.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_220.refcount != (int *)0x0) {
                  LOCK();
                  *local_220.refcount = *local_220.refcount + -1;
                  UNLOCK();
                  if (*local_220.refcount == 0) {
                    if (local_220.allocator == (Allocator *)0x0) {
                      free(local_220.data);
                    }
                    else {
                      (*(local_220.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar22 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_004b5bf5;
              }
              m_2.data = local_220.data;
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = (undefined4)local_220.elemsize;
              m_2.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
              m_2.elempack = local_220.elempack;
              m_2.allocator = local_220.allocator;
              m_2.dims = 2;
              m_2.w = local_220.w;
              m_2.h = local_220.h;
              m_2.cstep = (long)local_220.h * (long)local_220.w;
              m_2.d = 1;
              m_2.c = 1;
              transpose(&m_2,&local_188,(Option *)(ulong)(uint)local_220.elempack);
            }
            else {
              local_188.data = local_220.data;
              local_188.refcount._0_4_ = 0;
              local_188.refcount._4_4_ = 0;
              local_188.elemsize._0_4_ = (undefined4)local_220.elemsize;
              local_188.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
              local_188.elempack = local_220.elempack;
              local_188.allocator = local_220.allocator;
              local_188.dims = 2;
              local_188.w = local_220.w;
              local_188.cstep = (long)local_220.w * (long)local_220.h;
              local_188.h = local_220.h;
              local_188.d = 1;
              local_188.c = 1;
            }
          }
          if ((int)uVar32 < 1) {
            uVar29 = 0;
          }
          uVar27 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar27 = 0;
          }
          for (uVar31 = 0; iVar21 = local_1d8.c, iVar1 = local_220.c, uVar31 != uVar27;
              uVar31 = uVar31 + 1) {
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            m_2.allocator = (Allocator *)0x0;
            m_2.dims = 0;
            m_2.w = 0;
            if (local_220.c != 1 && local_220.d == 1) {
              if (local_138->transB == 0) {
                Mat::create(&m_2,local_220.h,local_220.w,(size_t)local_140,
                            local_130->workspace_allocator);
                if ((m_2.data == (void *)0x0) || ((long)m_2.c * m_2.cstep == 0)) {
                  piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar22 != (int *)0x0) {
                    LOCK();
                    *piVar22 = *piVar22 + -1;
                    UNLOCK();
                    if (*piVar22 == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        free(m_2.data);
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
LAB_004b5b56:
                  piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                  if (piVar22 != (int *)0x0) {
                    LOCK();
                    *piVar22 = *piVar22 + -1;
                    UNLOCK();
                    if (*piVar22 == 0) {
                      if (local_188.allocator == (Allocator *)0x0) {
                        free(local_188.data);
                      }
                      else {
                        (*(local_188.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (local_220.refcount != (int *)0x0) {
                    LOCK();
                    *local_220.refcount = *local_220.refcount + -1;
                    UNLOCK();
                    if (*local_220.refcount == 0) {
                      if (local_220.allocator == (Allocator *)0x0) {
                        free(local_220.data);
                      }
                      else {
                        (*(local_220.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                  if (piVar22 == (int *)0x0) {
                    return -100;
                  }
                  LOCK();
                  *piVar22 = *piVar22 + -1;
                  UNLOCK();
                  if (*piVar22 != 0) {
                    return -100;
                  }
                  if (local_1d8.allocator != (Allocator *)0x0) {
                    (*(local_1d8.allocator)->_vptr_Allocator[3])();
                    return -100;
                  }
                  goto LAB_004b5bf5;
                }
                m.data = (void *)(local_220.cstep * uVar31 * local_220.elemsize +
                                 (long)local_220.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)local_220.elemsize;
                m.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
                m.elempack = local_220.elempack;
                m.allocator = local_220.allocator;
                m.dims = 2;
                m.w = local_220.w;
                m.h = local_220.h;
                m.cstep = (long)local_220.h * (long)local_220.w;
                m.d = 1;
                m.c = 1;
                transpose(&m,&m_2,(Option *)(ulong)(uint)local_220.elempack);
              }
              else {
                m_2.data = (void *)(local_220.cstep * uVar31 * local_220.elemsize +
                                   (long)local_220.data);
                m_2.refcount._0_4_ = 0;
                m_2.refcount._4_4_ = 0;
                m_2.elemsize._0_4_ = (undefined4)local_220.elemsize;
                m_2.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
                m_2.elempack = local_220.elempack;
                m_2.allocator = local_220.allocator;
                m_2.dims = 2;
                m_2.w = local_220.w;
                m_2.cstep = (long)local_220.w * (long)local_220.h;
                m_2.h = local_220.h;
                m_2.d = 1;
                m_2.c = 1;
              }
            }
            uVar26 = uVar31 & 0xffffffff;
            uVar24 = uVar26;
            if (iVar1 == 1) {
              uVar24 = 0;
            }
            if (iVar21 == 1) {
              uVar26 = 0;
            }
            for (uVar25 = 0; iVar1 = local_1d8.d, uVar29 != uVar25; uVar25 = uVar25 + 1) {
              uVar32 = (uint)uVar25;
              if (local_220.d == 1) {
                uVar32 = 0;
              }
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              if (local_220.c != 1 || local_220.d != 1) {
                if (local_220.c == 1 || local_220.d != 1) {
                  if (local_138->transB == 0) {
                    Mat::create(&m,local_220.h,local_220.w,(size_t)local_140,
                                local_130->workspace_allocator);
                    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
                      piVar22 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                      if (piVar22 != (int *)0x0) {
                        LOCK();
                        *piVar22 = *piVar22 + -1;
                        UNLOCK();
                        if (*piVar22 == 0) {
                          if (m.allocator == (Allocator *)0x0) {
                            free(m.data);
                          }
                          else {
                            (*(m.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar22 != (int *)0x0) {
                        LOCK();
                        *piVar22 = *piVar22 + -1;
                        UNLOCK();
                        if (*piVar22 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            free(m_2.data);
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      goto LAB_004b5b56;
                    }
                    pOVar23 = (Option *)
                              (local_220.cstep * uVar24 * local_220.elemsize + (long)local_220.data)
                    ;
                    m_7.cstep = (long)local_220.w * (long)local_220.h;
                    m_7.data = &pOVar23->lightmode + m_7.cstep * local_220.elemsize * (ulong)uVar32;
                    m_7.refcount = (int *)0x0;
                    m_7.elemsize = local_220.elemsize;
                    m_7.elempack = local_220.elempack;
                    m_7.allocator = local_220.allocator;
                    m_7.dims = 2;
                    m_7.w = local_220.w;
                    m_7.h = local_220.h;
                    m_7.d = 1;
                    m_7.c = 1;
                    transpose(&m_7,&m,pOVar23);
                  }
                  else {
                    m.cstep = (long)local_220.h * (long)local_220.w;
                    m.data = (void *)((long)local_220.data +
                                     m.cstep * local_220.elemsize * (ulong)uVar32 +
                                     local_220.cstep * uVar24 * local_220.elemsize);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)local_220.elemsize;
                    m.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
                    m.elempack = local_220.elempack;
                    m.allocator = local_220.allocator;
                    m.dims = 2;
                    m.w = local_220.w;
                    m.h = local_220.h;
                    m.d = 1;
                    m.c = 1;
                  }
                }
                else {
                  piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar22 != (int *)0x0) {
                    LOCK();
                    *piVar22 = *piVar22 + 1;
                    UNLOCK();
                  }
                  m.data = m_2.data;
                  m.refcount._0_4_ = m_2.refcount._0_4_;
                  m.refcount._4_4_ = m_2.refcount._4_4_;
                  m.elemsize._0_4_ = (undefined4)m_2.elemsize;
                  m.elemsize._4_4_ = m_2.elemsize._4_4_;
                  m.elempack = m_2.elempack;
                  m.allocator = m_2.allocator;
                  m.dims = m_2.dims;
                  m.w = m_2.w;
                  m.h = m_2.h;
                  m.d = m_2.d;
                  m.c = m_2.c;
                  m.cstep = m_2.cstep;
                }
              }
              else {
                piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                if (piVar22 != (int *)0x0) {
                  LOCK();
                  *piVar22 = *piVar22 + 1;
                  UNLOCK();
                }
                m.data = local_188.data;
                m.refcount._0_4_ = local_188.refcount._0_4_;
                m.refcount._4_4_ = local_188.refcount._4_4_;
                m.elemsize._0_4_ = (undefined4)local_188.elemsize;
                m.elemsize._4_4_ = local_188.elemsize._4_4_;
                m.elempack = local_188.elempack;
                m.allocator = local_188.allocator;
                m.dims = local_188.dims;
                m.w = local_188.w;
                m.h = local_188.h;
                m.d = local_188.d;
                m.c = local_188.c;
                m.cstep = local_188.cstep;
              }
              m_7.w = this_02->w;
              m_7.h = this_02->h;
              m_7.elemsize = this_02->elemsize;
              m_7.elempack = this_02->elempack;
              m_7.allocator = this_02->allocator;
              m_7.cstep = (long)m_7.h * (long)m_7.w;
              m_7.data = (void *)((long)this_02->data +
                                 uVar25 * m_7.elemsize * m_7.cstep +
                                 this_02->cstep * uVar31 * m_7.elemsize);
              m_7.refcount = (int *)0x0;
              m_7.dims = 2;
              m_7.d = 1;
              m_7.c = 1;
              local_78.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
              pOVar23 = (Option *)
                        (local_1d8.cstep * uVar26 * local_78.elemsize + (long)local_1d8.data);
              local_78.cstep = (long)local_1d8.h * (long)local_1d8.w;
              uVar28 = 0;
              if (iVar1 != 1) {
                uVar28 = uVar25;
              }
              local_78.data = &pOVar23->lightmode + uVar28 * local_78.cstep * local_78.elemsize;
              local_78.refcount = (int *)0x0;
              local_78.elempack = local_1d8.elempack;
              local_78.allocator = local_1d8.allocator;
              local_78.w = local_1d8.w;
              local_78.h = local_1d8.h;
              local_78.d = 1;
              local_78.c = 1;
              local_78.dims = m_7.dims;
              matmul_transb(&local_78,&m,&m_7,pOVar23);
              piVar22 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar22 != (int *)0x0) {
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
            if (piVar22 != (int *)0x0) {
              LOCK();
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  free(m_2.data);
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + -1;
            UNLOCK();
            if (*piVar22 == 0) {
              if (local_188.allocator == (Allocator *)0x0) {
                free(local_188.data);
              }
              else {
                (*(local_188.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_220.refcount != (int *)0x0) {
            LOCK();
            *local_220.refcount = *local_220.refcount + -1;
            UNLOCK();
            if (*local_220.refcount == 0) {
              if (local_220.allocator == (Allocator *)0x0) {
                free(local_220.data);
              }
              else {
                (*(local_220.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar22 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 != 0) {
            return 0;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            return 0;
          }
          goto LAB_004b5a55;
        }
        if (local_220.refcount != (int *)0x0) {
          LOCK();
          *local_220.refcount = *local_220.refcount + -1;
          UNLOCK();
          if (*local_220.refcount == 0) {
            if (local_220.allocator == (Allocator *)0x0) {
              free(local_220.data);
            }
            else {
              (*(local_220.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar22 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 != 0) {
          return -100;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
      }
      else {
        if (uVar2 != 3) {
          fprintf(_stderr,"impossible matmul %d %d",(ulong)uVar32,(ulong)uVar30);
          fputc(10,_stderr);
          return -1;
        }
        if (uVar32 == 2) {
          local_1d8.elemsize._0_4_ = uVar19;
          local_1d8.elemsize._4_4_ = uVar20;
          Mat::reshape(&local_1d8,this_01,this_01->w,this_01->h,1,(Allocator *)0x0);
        }
        else {
          local_1d8.data = this_01->data;
          piVar22 = this_01->refcount;
          local_1d8.refcount._0_4_ = SUB84(piVar22,0);
          local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar22 >> 0x20);
          local_1d8.elempack = this_01->elempack;
          local_1d8.allocator = this_01->allocator;
          uVar3 = this_01->w;
          uVar4 = this_01->h;
          uVar5 = this_01->d;
          uVar6 = this_01->c;
          local_1d8.cstep = this_01->cstep;
          local_1d8.dims = uVar32;
          local_1d8.w = uVar3;
          local_1d8.h = uVar4;
          local_1d8.d = uVar5;
          local_1d8.c = uVar6;
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
        }
        if (uVar30 == 2) {
          Mat::reshape(&local_220,this_00,this_01[1].w,this_01[1].h,1,(Allocator *)0x0);
        }
        else {
          local_220.data = this_01[1].data;
          local_220.refcount = this_01[1].refcount;
          local_220.elemsize = this_01[1].elemsize;
          local_220.elempack = this_01[1].elempack;
          local_220.allocator = this_01[1].allocator;
          local_220.dims = this_01[1].dims;
          local_220.w = this_01[1].w;
          local_220.h = this_01[1].h;
          local_220.d = this_01[1].d;
          local_220.c = this_01[1].c;
          local_220.cstep = this_01[1].cstep;
          if (local_220.refcount != (int *)0x0) {
            LOCK();
            *local_220.refcount = *local_220.refcount + 1;
            UNLOCK();
          }
        }
        pOVar23 = local_130;
        uVar32 = local_220.c;
        if (local_220.c < local_1d8.c) {
          uVar32 = local_1d8.c;
        }
        Mat::create(this_02,(&local_220.w)[local_138->transB != 0],local_1d8.h,uVar32,
                    (size_t)local_140,local_130->blob_allocator);
        if ((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
          local_188.cstep = 0;
          local_188.data = (void *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.elemsize._0_4_ = 0;
          local_188.elemsize._4_4_ = 0;
          local_188.elempack = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          local_188.h = 0;
          local_188.d = 0;
          local_188.c = 0;
          if (local_220.c == 1) {
            if (local_138->transB == 0) {
              Mat::create(&local_188,local_220.h,local_220.w,(size_t)local_140,
                          pOVar23->workspace_allocator);
              if ((local_188.data == (void *)0x0) || ((long)local_188.c * local_188.cstep == 0)) {
                piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                if (piVar22 != (int *)0x0) {
                  LOCK();
                  *piVar22 = *piVar22 + -1;
                  UNLOCK();
                  if (*piVar22 == 0) {
                    if (local_188.allocator == (Allocator *)0x0) {
                      free(local_188.data);
                    }
                    else {
                      (*(local_188.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_220.refcount != (int *)0x0) {
                  LOCK();
                  *local_220.refcount = *local_220.refcount + -1;
                  UNLOCK();
                  if (*local_220.refcount == 0) {
                    if (local_220.allocator == (Allocator *)0x0) {
                      free(local_220.data);
                    }
                    else {
                      (*(local_220.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar22 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_004b5bf5;
              }
              m_2.data = local_220.data;
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = (undefined4)local_220.elemsize;
              m_2.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
              m_2.elempack = local_220.elempack;
              m_2.allocator = local_220.allocator;
              m_2.w = local_220.w;
              m_2.h = local_220.h;
              m_2.d = 1;
              m_2.c = local_220.d;
              m_2.dims = local_220.dims - 1;
              m_2.cstep = (local_220.elemsize * (long)local_220.h * (long)local_220.w + 0xf &
                          0xfffffffffffffff0) / local_220.elemsize;
              if (local_220.dims == 4) {
                m_2.cstep = (long)local_220.h * (long)local_220.w;
              }
              transpose(&m_2,&local_188,(Option *)(ulong)(uint)m_2.dims);
            }
            else {
              local_188.cstep =
                   (local_220.elemsize * (long)local_220.h * (long)local_220.w + 0xf &
                   0xfffffffffffffff0) / local_220.elemsize;
              if (local_220.dims == 4) {
                local_188.cstep = (long)local_220.h * (long)local_220.w;
              }
              local_188.dims = local_220.dims + -1;
              local_188.data = local_220.data;
              local_188.refcount._0_4_ = 0;
              local_188.refcount._4_4_ = 0;
              local_188.elemsize._0_4_ = (undefined4)local_220.elemsize;
              local_188.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
              local_188.elempack = local_220.elempack;
              local_188.allocator = local_220.allocator;
              local_188.w = local_220.w;
              local_188.h = local_220.h;
              local_188.d = 1;
              local_188.c = local_220.d;
            }
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          for (uVar29 = 0; iVar1 = local_1d8.c, uVar32 != uVar29; uVar29 = uVar29 + 1) {
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            m_2.allocator = (Allocator *)0x0;
            m_2.dims = 0;
            m_2.w = 0;
            if (local_220.c == 1) {
              piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
              if (piVar22 != (int *)0x0) {
                LOCK();
                *piVar22 = *piVar22 + 1;
                UNLOCK();
              }
              m_2.data = local_188.data;
              m_2.refcount._0_4_ = local_188.refcount._0_4_;
              m_2.refcount._4_4_ = local_188.refcount._4_4_;
              m_2.elemsize._0_4_ = (undefined4)local_188.elemsize;
              m_2.elemsize._4_4_ = local_188.elemsize._4_4_;
              m_2.elempack = local_188.elempack;
              m_2.allocator = local_188.allocator;
              m_2.dims = local_188.dims;
              m_2.w = local_188.w;
              m_2.h = local_188.h;
              m_2.d = local_188.d;
              m_2.c = local_188.c;
              m_2.cstep = local_188.cstep;
            }
            else if (local_138->transB == 0) {
              Mat::create(&m_2,local_220.h,local_220.w,(size_t)local_140,
                          local_130->workspace_allocator);
              if ((m_2.data == (void *)0x0) || ((long)m_2.c * m_2.cstep == 0)) {
                piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                if (piVar22 != (int *)0x0) {
                  LOCK();
                  *piVar22 = *piVar22 + -1;
                  UNLOCK();
                  if (*piVar22 == 0) {
                    if (m_2.allocator == (Allocator *)0x0) {
                      free(m_2.data);
                    }
                    else {
                      (*(m_2.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                if (piVar22 != (int *)0x0) {
                  LOCK();
                  *piVar22 = *piVar22 + -1;
                  UNLOCK();
                  if (*piVar22 == 0) {
                    if (local_188.allocator == (Allocator *)0x0) {
                      free(local_188.data);
                    }
                    else {
                      (*(local_188.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_220.refcount != (int *)0x0) {
                  LOCK();
                  *local_220.refcount = *local_220.refcount + -1;
                  UNLOCK();
                  if (*local_220.refcount == 0) {
                    if (local_220.allocator == (Allocator *)0x0) {
                      free(local_220.data);
                    }
                    else {
                      (*(local_220.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar22 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_004b5bf5;
              }
              m.data = (void *)(local_220.cstep * uVar29 * local_220.elemsize + (long)local_220.data
                               );
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = (undefined4)local_220.elemsize;
              m.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
              m.elempack = local_220.elempack;
              m.allocator = local_220.allocator;
              m.w = local_220.w;
              m.h = local_220.h;
              m.d = 1;
              m.c = local_220.d;
              m.dims = local_220.dims - 1;
              m.cstep = (local_220.elemsize * (long)local_220.h * (long)local_220.w + 0xf &
                        0xfffffffffffffff0) / local_220.elemsize;
              if (local_220.dims == 4) {
                m.cstep = (long)local_220.h * (long)local_220.w;
              }
              transpose(&m,&m_2,(Option *)(ulong)(uint)m.dims);
            }
            else {
              m_2.cstep = (local_220.elemsize * (long)local_220.h * (long)local_220.w + 0xf &
                          0xfffffffffffffff0) / local_220.elemsize;
              if (local_220.dims == 4) {
                m_2.cstep = (long)local_220.h * (long)local_220.w;
              }
              m_2.dims = local_220.dims + -1;
              m_2.data = (void *)(local_220.cstep * uVar29 * local_220.elemsize +
                                 (long)local_220.data);
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = (undefined4)local_220.elemsize;
              m_2.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
              m_2.elempack = local_220.elempack;
              m_2.allocator = local_220.allocator;
              m_2.w = local_220.w;
              m_2.h = local_220.h;
              m_2.d = 1;
              m_2.c = local_220.d;
            }
            m.w = this_02->w;
            m.h = this_02->h;
            uVar27 = this_02->elemsize;
            m.data = (void *)(this_02->cstep * uVar29 * uVar27 + (long)this_02->data);
            m.c = this_02->d;
            m.elempack = this_02->elempack;
            m.allocator = this_02->allocator;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = (undefined4)uVar27;
            m.elemsize._4_4_ = (undefined4)(uVar27 >> 0x20);
            m.d = 1;
            m.dims = this_02->dims + -1;
            m.cstep = (uVar27 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar27;
            if (this_02->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            uVar27 = uVar29;
            if (iVar1 == 1) {
              uVar27 = 0;
            }
            m_7.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
            m_7.data = (void *)(uVar27 * local_1d8.cstep * m_7.elemsize + (long)local_1d8.data);
            m_7.refcount = (int *)0x0;
            m_7.elempack = local_1d8.elempack;
            m_7.allocator = local_1d8.allocator;
            m_7.w = local_1d8.w;
            m_7.h = local_1d8.h;
            m_7.c = local_1d8.d;
            m_7.d = 1;
            pOVar23 = (Option *)((long)local_1d8.h * (long)local_1d8.w);
            m_7.dims = local_1d8.dims - 1;
            m_7.cstep = (m_7.elemsize * (long)pOVar23 + 0xf & 0xfffffffffffffff0) / m_7.elemsize;
            if (local_1d8.dims == 4) {
              m_7.cstep = (size_t)pOVar23;
            }
            matmul_transb(&m_7,&m_2,&m,pOVar23);
            piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
            if (piVar22 != (int *)0x0) {
              LOCK();
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  free(m_2.data);
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
          if (piVar22 != (int *)0x0) {
            LOCK();
            *piVar22 = *piVar22 + -1;
            UNLOCK();
            if (*piVar22 == 0) {
              if (local_188.allocator == (Allocator *)0x0) {
                free(local_188.data);
              }
              else {
                (*(local_188.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_220.refcount != (int *)0x0) {
            LOCK();
            *local_220.refcount = *local_220.refcount + -1;
            UNLOCK();
            if (*local_220.refcount == 0) {
              if (local_220.allocator == (Allocator *)0x0) {
                free(local_220.data);
              }
              else {
                (*(local_220.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar22 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 != 0) {
            return 0;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            return 0;
          }
          goto LAB_004b5a55;
        }
        if (local_220.refcount != (int *)0x0) {
          LOCK();
          *local_220.refcount = *local_220.refcount + -1;
          UNLOCK();
          if (*local_220.refcount == 0) {
            if (local_220.allocator == (Allocator *)0x0) {
              free(local_220.data);
            }
            else {
              (*(local_220.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar22 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 != 0) {
          return -100;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
      }
LAB_004b5bf5:
      free(local_1d8.data);
      return -100;
    }
    uVar30 = this_01->c * this_01->d;
    local_1d8.cstep = 0;
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    local_138 = (MatMul *)CONCAT44((int)((ulong)this >> 0x20),this_01->h);
    Mat::create(&local_1d8,1,this_01->h,uVar30,(size_t)pOVar23,opt->blob_allocator);
    if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
      piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar22 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 != 0) {
        return -100;
      }
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_004b5bf5;
    }
    Mat::reshape(&local_220,this_01,this_01->w,this_01->h,uVar30,(Allocator *)0x0);
    uVar27 = 0;
    Mat::reshape(&local_188,this_00,this_01[1].w,1,(Allocator *)0x0);
    uVar29 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar29 = uVar27;
    }
    for (; uVar29 != uVar27; uVar27 = uVar27 + 1) {
      uVar31 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      m_2.data = (void *)(local_1d8.cstep * uVar27 * uVar31 + (long)local_1d8.data);
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)local_1d8.elemsize;
      m_2.elemsize._4_4_ = local_1d8.elemsize._4_4_;
      m_2.elempack = local_1d8.elempack;
      m_2.allocator = local_1d8.allocator;
      m_2.w = local_1d8.w;
      m_2.h = local_1d8.h;
      m_2.d = 1;
      m_2.c = local_1d8.d;
      m_2.dims = local_1d8.dims - 1;
      m_2.cstep = (uVar31 * (long)local_1d8.h * (long)local_1d8.w + 0xf & 0xfffffffffffffff0) /
                  uVar31;
      if (local_1d8.dims == 4) {
        m_2.cstep = (long)local_1d8.h * (long)local_1d8.w;
      }
      m.data = (void *)(local_220.cstep * uVar27 * local_220.elemsize + (long)local_220.data);
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)local_220.elemsize;
      m.elemsize._4_4_ = (undefined4)(local_220.elemsize >> 0x20);
      m.elempack = local_220.elempack;
      m.allocator = local_220.allocator;
      m.w = local_220.w;
      m.h = local_220.h;
      m.d = 1;
      m.c = local_220.d;
      pOVar23 = (Option *)((long)local_220.h * (long)local_220.w);
      m.dims = local_220.dims + -1;
      m.cstep = (local_220.elemsize * (long)pOVar23 + 0xf & 0xfffffffffffffff0) / local_220.elemsize
      ;
      if (local_220.dims == 4) {
        m.cstep = (size_t)pOVar23;
      }
      matmul_transb(&m,&local_188,&m_2,pOVar23);
    }
    if (uVar32 == 3) {
      Mat::reshape(&m_2,&local_1d8,(int)local_138,this_01->c * this_01->d,(Allocator *)0x0);
      piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (this_02 != &m_2) {
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + 1;
          UNLOCK();
        }
        piVar22 = this_02->refcount;
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (this_02->allocator == (Allocator *)0x0) {
              free(this_02->data);
            }
            else {
              (*this_02->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_02->data = m_2.data;
        piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
        this_02->refcount = piVar22;
        this_02->elemsize = CONCAT44(m_2.elemsize._4_4_,(undefined4)m_2.elemsize);
        this_02->elempack = m_2.elempack;
        this_02->allocator = m_2.allocator;
        this_02->dims = m_2.dims;
        this_02->w = m_2.w;
        this_02->h = m_2.h;
        this_02->d = m_2.d;
        this_02->c = m_2.c;
        this_02->cstep = m_2.cstep;
      }
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
LAB_004b585a:
            free(m_2.data);
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&m_2,&local_1d8,(int)local_138,this_01->d,this_01->c,(Allocator *)0x0);
      piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (this_02 != &m_2) {
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + 1;
          UNLOCK();
        }
        piVar22 = this_02->refcount;
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (this_02->allocator == (Allocator *)0x0) {
              free(this_02->data);
            }
            else {
              (*this_02->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_02->data = m_2.data;
        piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
        this_02->refcount = piVar22;
        this_02->elemsize = CONCAT44(m_2.elemsize._4_4_,(undefined4)m_2.elemsize);
        this_02->elempack = m_2.elempack;
        this_02->allocator = m_2.allocator;
        this_02->dims = m_2.dims;
        this_02->w = m_2.w;
        this_02->h = m_2.h;
        this_02->d = m_2.d;
        this_02->c = m_2.c;
        this_02->cstep = m_2.cstep;
      }
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (m_2.allocator == (Allocator *)0x0) goto LAB_004b585a;
          (*(m_2.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          free(local_188.data);
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_220.refcount != (int *)0x0) {
      LOCK();
      *local_220.refcount = *local_220.refcount + -1;
      UNLOCK();
      if (*local_220.refcount == 0) {
        if (local_220.allocator == (Allocator *)0x0) {
          free(local_220.data);
        }
        else {
          (*(local_220.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar22 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 != 0) {
      return 0;
    }
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      return 0;
    }
    goto LAB_004b5a55;
  }
  iVar1 = (&this_01[1].w)[this->transB != 0];
  uVar32 = this_01[1].c * this_01[1].d;
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  Mat::create(&local_1d8,iVar1,1,uVar32,(size_t)pOVar23,opt->blob_allocator);
  if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
    piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar22 == (int *)0x0) {
      return -100;
    }
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 != 0) {
      return -100;
    }
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      return -100;
    }
    goto LAB_004b5bf5;
  }
  Mat::reshape(&local_220,this_01,this_01->w,1,(Allocator *)0x0);
  uVar27 = 0;
  Mat::reshape(&local_188,this_00,this_01[1].w,this_01[1].h,uVar32,(Allocator *)0x0);
  uVar29 = (ulong)uVar32;
  if ((int)uVar32 < 1) {
    uVar29 = uVar27;
  }
  for (; uVar29 != uVar27; uVar27 = uVar27 + 1) {
    m_2.cstep = 0;
    m_2.data = (void *)0x0;
    m_2.refcount._0_4_ = 0;
    m_2.refcount._4_4_ = 0;
    m_2.elemsize._0_4_ = 0;
    m_2.elemsize._4_4_ = 0;
    m_2.elempack = 0;
    m_2.h = 0;
    m_2.d = 0;
    m_2.c = 0;
    m_2.allocator = (Allocator *)0x0;
    m_2.dims = 0;
    m_2.w = 0;
    if (local_138->transB == 0) {
      Mat::create(&m_2,this_01[1].h,this_01[1].w,(size_t)local_140,local_130->workspace_allocator);
      if ((m_2.data == (void *)0x0) || ((long)m_2.c * m_2.cstep == 0)) {
        piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (m_2.allocator == (Allocator *)0x0) {
              free(m_2.data);
            }
            else {
              (*(m_2.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              free(local_188.data);
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_220.refcount != (int *)0x0) {
          LOCK();
          *local_220.refcount = *local_220.refcount + -1;
          UNLOCK();
          if (*local_220.refcount == 0) {
            if (local_220.allocator == (Allocator *)0x0) {
              free(local_220.data);
            }
            else {
              (*(local_220.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar22 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 != 0) {
          return -100;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_004b5bf5;
      }
      uVar31 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      m.data = (void *)(local_188.cstep * uVar27 * uVar31 + (long)local_188.data);
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elempack = local_188.elempack;
      m.allocator = local_188.allocator;
      m.w = local_188.w;
      m.h = local_188.h;
      m.d = 1;
      m.c = local_188.d;
      m.dims = local_188.dims - 1;
      m.cstep = (uVar31 * (long)local_188.h * (long)local_188.w + 0xf & 0xfffffffffffffff0) / uVar31
      ;
      if (local_188.dims == 4) {
        m.cstep = (long)local_188.h * (long)local_188.w;
      }
      transpose(&m,&m_2,(Option *)(ulong)(uint)m.dims);
    }
    else {
      uVar31 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      m_2.cstep = (uVar31 * (long)local_188.h * (long)local_188.w + 0xf & 0xfffffffffffffff0) /
                  uVar31;
      if (local_188.dims == 4) {
        m_2.cstep = (long)local_188.h * (long)local_188.w;
      }
      m_2.dims = local_188.dims + -1;
      m_2.data = (void *)(local_188.cstep * uVar27 * uVar31 + (long)local_188.data);
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)local_188.elemsize;
      m_2.elemsize._4_4_ = local_188.elemsize._4_4_;
      m_2.elempack = local_188.elempack;
      m_2.allocator = local_188.allocator;
      m_2.w = local_188.w;
      m_2.h = local_188.h;
      m_2.d = 1;
      m_2.c = local_188.d;
    }
    uVar31 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
    m.data = (void *)(local_1d8.cstep * uVar27 * uVar31 + (long)local_1d8.data);
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)local_1d8.elemsize;
    m.elemsize._4_4_ = local_1d8.elemsize._4_4_;
    m.elempack = local_1d8.elempack;
    m.allocator = local_1d8.allocator;
    m.w = local_1d8.w;
    m.h = local_1d8.h;
    m.d = 1;
    m.c = local_1d8.d;
    pOVar23 = (Option *)((long)local_1d8.h * (long)local_1d8.w);
    m.dims = local_1d8.dims - 1;
    m.cstep = (uVar31 * (long)pOVar23 + 0xf & 0xfffffffffffffff0) / uVar31;
    if (local_1d8.dims == 4) {
      m.cstep = (size_t)pOVar23;
    }
    matmul_transb(&local_220,&m_2,&m,pOVar23);
    piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (m_2.allocator == (Allocator *)0x0) {
          free(m_2.data);
        }
        else {
          (*(m_2.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (uVar30 == 3) {
    Mat::reshape(&m_2,&local_1d8,iVar1,this_01[1].c * this_01[1].d,(Allocator *)0x0);
    piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
    if (this_02 != &m_2) {
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      piVar22 = this_02->refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (this_02->allocator == (Allocator *)0x0) {
            free(this_02->data);
          }
          else {
            (*this_02->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_02->data = m_2.data;
      piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      this_02->refcount = piVar22;
      this_02->elemsize = CONCAT44(m_2.elemsize._4_4_,(undefined4)m_2.elemsize);
      this_02->elempack = m_2.elempack;
      this_02->allocator = m_2.allocator;
      this_02->dims = m_2.dims;
      this_02->w = m_2.w;
      this_02->h = m_2.h;
      this_02->d = m_2.d;
      this_02->c = m_2.c;
      this_02->cstep = m_2.cstep;
    }
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (m_2.allocator == (Allocator *)0x0) {
LAB_004b560f:
          free(m_2.data);
        }
        else {
          (*(m_2.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape(&m_2,&local_1d8,iVar1,this_01[1].d,this_01[1].c,(Allocator *)0x0);
    piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
    if (this_02 != &m_2) {
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + 1;
        UNLOCK();
      }
      piVar22 = this_02->refcount;
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          if (this_02->allocator == (Allocator *)0x0) {
            free(this_02->data);
          }
          else {
            (*this_02->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_02->data = m_2.data;
      piVar22 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      this_02->refcount = piVar22;
      this_02->elemsize = CONCAT44(m_2.elemsize._4_4_,(undefined4)m_2.elemsize);
      this_02->elempack = m_2.elempack;
      this_02->allocator = m_2.allocator;
      this_02->dims = m_2.dims;
      this_02->w = m_2.w;
      this_02->h = m_2.h;
      this_02->d = m_2.d;
      this_02->c = m_2.c;
      this_02->cstep = m_2.cstep;
    }
    if (piVar22 != (int *)0x0) {
      LOCK();
      *piVar22 = *piVar22 + -1;
      UNLOCK();
      if (*piVar22 == 0) {
        if (m_2.allocator == (Allocator *)0x0) goto LAB_004b560f;
        (*(m_2.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar22 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        free(local_188.data);
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_220.refcount != (int *)0x0) {
    LOCK();
    *local_220.refcount = *local_220.refcount + -1;
    UNLOCK();
    if (*local_220.refcount == 0) {
      if (local_220.allocator == (Allocator *)0x0) {
        free(local_220.data);
      }
      else {
        (*(local_220.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar22 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  if (piVar22 == (int *)0x0) {
    return 0;
  }
  LOCK();
  *piVar22 = *piVar22 + -1;
  UNLOCK();
  if (*piVar22 != 0) {
    return 0;
  }
  if (local_1d8.allocator != (Allocator *)0x0) {
    (*(local_1d8.allocator)->_vptr_Allocator[3])();
    return 0;
  }
LAB_004b5a55:
  free(local_1d8.data);
  return 0;
}

Assistant:

int MatMul::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        top_blob.create(1, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int K = A.w; // assert A.w == B.w
        const float* ptrA = A;
        const float* ptrB = B;

        float sum = 0.f;
        for (int k = 0; k < K; k++)
        {
            sum += ptrA[k] * ptrB[k];
        }

        top_blob[0] = sum;
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        const int M = A.h;
        const int N = transB == 0 ? B.w : B.h;

        top_blob.create(N, M, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat BT;
        if (transB == 0)
        {
            BT.create(B.h, B.w, elemsize, opt.workspace_allocator);
            if (BT.empty())
                return -100;

            transpose(B, BT, opt);
        }
        else
        {
            BT = B;
        }

        matmul_transb(A, BT, top_blob, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        const int N = transB == 0 ? B.w : B.h;

        Mat top_blob1(N, 1, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);

        Mat BT;
        if (transB == 0)
        {
            BT.create(B.h, B.w, elemsize, opt.workspace_allocator);
            if (BT.empty())
                return -100;

            transpose(B, BT, opt);
        }
        else
        {
            BT = B;
        }

        matmul_transb(A1, BT, top_blob1, opt);

        top_blob = top_blob1.reshape(N);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        const int M = A.h;

        Mat top_blob1(1, M, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat BT = B.reshape(B.w, 1);

        matmul_transb(A, BT, top_blob1, opt);

        top_blob = top_blob1.reshape(M);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            Mat BT;
            if (transB == 0)
            {
                BT.create(B.h, B.w, elemsize, opt.workspace_allocator);
                if (BT.empty())
                    return -100;

                transpose(B1.channel(p), BT, opt);
            }
            else
            {
                BT = B1.channel(p);
            }

            Mat top_blob1_p = top_blob1.channel(p);
            matmul_transb(A1, BT, top_blob1_p, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = B.reshape(B.w, 1);

        for (int p = 0; p < batch_size; p++)
        {
            Mat top_blob1_p = top_blob1.channel(p);
            matmul_transb(A1.channel(p), BT, top_blob1_p, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat BT0;
        if (B1.c == 1)
        {
            if (transB == 0)
            {
                BT0.create(B1.h, B1.w, elemsize, opt.workspace_allocator);
                if (BT0.empty())
                    return -100;

                transpose(B1.channel(0), BT0, opt);
            }
            else
            {
                BT0 = B1.channel(0);
            }
        }

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            Mat BT;
            if (B1.c == 1)
            {
                BT = BT0;
            }
            else
            {
                if (transB == 0)
                {
                    BT.create(B1.h, B1.w, elemsize, opt.workspace_allocator);
                    if (BT.empty())
                        return -100;

                    transpose(B1.channel(Bp), BT, opt);
                }
                else
                {
                    BT = B1.channel(Bp);
                }
            }

            Mat top_blob_p = top_blob.channel(p);
            matmul_transb(A1.channel(Ap), BT, top_blob_p, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat BT00;
        if (B1.d == 1 && B1.c == 1)
        {
            if (transB == 0)
            {
                BT00.create(B1.h, B1.w, elemsize, opt.workspace_allocator);
                if (BT00.empty())
                    return -100;

                transpose(B1.channel(0).depth(0), BT00, opt);
            }
            else
            {
                BT00 = B1.channel(0).depth(0);
            }
        }

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            Mat BT0x;
            if (B1.d == 1 && B1.c != 1)
            {
                if (transB == 0)
                {
                    BT0x.create(B1.h, B1.w, elemsize, opt.workspace_allocator);
                    if (BT0x.empty())
                        return -100;

                    transpose(B1.channel(Bp).depth(0), BT0x, opt);
                }
                else
                {
                    BT0x = B1.channel(Bp).depth(0);
                }
            }

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                Mat BT;
                if (B1.d == 1 && B1.c == 1)
                {
                    BT = BT00;
                }
                else if (B1.d == 1 && B1.c != 1)
                {
                    BT = BT0x;
                }
                else
                {
                    if (transB == 0)
                    {
                        BT.create(B1.h, B1.w, elemsize, opt.workspace_allocator);
                        if (BT.empty())
                            return -100;

                        transpose(B1.channel(Bp).depth(Bd), BT, opt);
                    }
                    else
                    {
                        BT = B1.channel(Bp).depth(Bd);
                    }
                }

                Mat top_blob_p_q = top_blob.channel(p).depth(q);
                matmul_transb(A1.channel(Ap).depth(Ad), BT, top_blob_p_q, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}